

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toScientificString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  int8_t iVar4;
  int iVar5;
  div_t dVar6;
  int position;
  int32_t start;
  ConstChar16Ptr local_40 [3];
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if ((this->flags & 1U) != 0) {
    UnicodeString::append(__return_storage_ptr__,L'-');
  }
  if (this->precision == 0) {
    local_40[0].p_ = L"0E+0";
    UnicodeString::append(__return_storage_ptr__,local_40,-1);
  }
  else {
    uVar2 = this->scale;
    iVar5 = this->precision + uVar2;
    if (this->lOptPos < iVar5) {
      iVar5 = this->lOptPos;
    }
    iVar5 = ~uVar2 + iVar5;
    uVar3 = this->rOptPos;
    if (this->rOptPos < (int)uVar2) {
      uVar3 = uVar2;
    }
    iVar4 = getDigitPos(this,iVar5);
    UnicodeString::append(__return_storage_ptr__,iVar4 + 0x30);
    if ((int)(uVar3 - uVar2) < iVar5) {
      UnicodeString::append(__return_storage_ptr__,L'.');
      position = iVar5;
      while ((int)(uVar3 - uVar2) < position) {
        position = position + -1;
        iVar4 = getDigitPos(this,position);
        UnicodeString::append(__return_storage_ptr__,iVar4 + 0x30);
      }
    }
    UnicodeString::append(__return_storage_ptr__,L'E');
    dVar6.quot = iVar5 + this->scale;
    dVar6.rem = 0;
    if ((int)dVar6.quot < 0) {
      UnicodeString::append(__return_storage_ptr__,L'-');
      dVar6.quot = -dVar6.quot;
      dVar6.rem = 0;
    }
    else {
      UnicodeString::append(__return_storage_ptr__,L'+');
      if (dVar6.quot == 0) {
        dVar6.quot = 0;
        dVar6.rem = 0;
        UnicodeString::append(__return_storage_ptr__,L'0');
      }
    }
    sVar1 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      start = (__return_storage_ptr__->fUnion).fFields.fLength;
    }
    else {
      start = (int)sVar1 >> 5;
    }
    while (0 < dVar6.quot) {
      dVar6 = div(dVar6.quot,10);
      UnicodeString::insert(__return_storage_ptr__,start,dVar6.rem + 0x30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toScientificString() const {
    U_ASSERT(!isApproximate);
    UnicodeString result;
    if (isNegative()) {
        result.append(u'-');
    }
    if (precision == 0) {
        result.append(u"0E+0", -1);
        return result;
    }
    // NOTE: It is not safe to add to lOptPos (aka maxInt) or subtract from
    // rOptPos (aka -maxFrac) due to overflow.
    int32_t upperPos = std::min(precision + scale, lOptPos) - scale - 1;
    int32_t lowerPos = std::max(scale, rOptPos) - scale;
    int32_t p = upperPos;
    result.append(u'0' + getDigitPos(p));
    if ((--p) >= lowerPos) {
        result.append(u'.');
        for (; p >= lowerPos; p--) {
            result.append(u'0' + getDigitPos(p));
        }
    }
    result.append(u'E');
    int32_t _scale = upperPos + scale;
    if (_scale < 0) {
        _scale *= -1;
        result.append(u'-');
    } else {
        result.append(u'+');
    }
    if (_scale == 0) {
        result.append(u'0');
    }
    int32_t insertIndex = result.length();
    while (_scale > 0) {
        std::div_t res = std::div(_scale, 10);
        result.insert(insertIndex, u'0' + res.rem);
        _scale = res.quot;
    }
    return result;
}